

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

vector<BN,_std::allocator<BN>_> * __thiscall
BN::expBest_SlidePrecomp(vector<BN,_std::allocator<BN>_> *__return_storage_ptr__,BN *this,BN *mod)

{
  undefined8 *puVar1;
  pointer puVar2;
  void *pvVar3;
  long lVar4;
  vector<BN,_std::allocator<BN>_> garr;
  BN mu;
  BN g;
  BN local_b8;
  vector<BN,_std::allocator<BN>_> local_98;
  BN local_78;
  BN local_60;
  BN local_48;
  
  std::vector<BN,_std::allocator<BN>_>::vector(&local_98,0x100,(allocator_type *)&local_60);
  anon_unknown.dwarf_10892::reductionBarrettPrecomputation(&local_60,mod);
  reductionBarrett(&local_48,this,mod,&local_60);
  bn1();
  if (local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      != &local_b8) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
              (&(local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                 super__Vector_impl_data._M_start)->ba,&local_b8.ba);
  }
  if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      + 1 != &local_48) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
              (&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data
                ._M_start[1].ba,&local_48.ba);
  }
  Qrt(&local_78,&local_48);
  reductionBarrett(&local_b8,&local_78,mod,&local_60);
  if (local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
      + 2 != &local_b8) {
    puVar2 = local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_start[2].ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start[2]
    .ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start[2]
    .ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start[2]
    .ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 == (pointer)0x0) goto LAB_0010b758;
    operator_delete(puVar2);
  }
  if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0010b758:
  if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  lVar4 = 0;
  do {
    karatsubaMultiplication
              (&local_78,
               (BN *)((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                             super__Vector_impl_data._M_start[1].ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar4),
               local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start + 2);
    reductionBarrett(&local_b8,&local_78,mod,&local_60);
    if ((BN *)((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                      super__Vector_impl_data._M_start[3].ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar4) == &local_b8) {
LAB_0010b7e1:
      if (local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      pvVar3 = *(void **)((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                                 super__Vector_impl_data._M_start[3].ba.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar4);
      puVar1 = (undefined8 *)
               ((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                       super__Vector_impl_data._M_start[3].ba.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4);
      *puVar1 = local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar1[1] = local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start[3].ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + lVar4) =
           local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3);
        goto LAB_0010b7e1;
      }
    }
    if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    lVar4 = lVar4 + 0x30;
    if (lVar4 == 0x17d0) {
      (__return_storage_ptr__->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
           _M_start;
      (__return_storage_ptr__->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      (__return_storage_ptr__->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      local_98.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.ba.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<BN,_std::allocator<BN>_>::~vector(&local_98);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

vector<BN> BN::expBest_SlidePrecomp(const BN& mod) const {
    vector <BN> garr (KarySize);
    BN mu = reductionBarrettPrecomputation(mod);
    BN g = this -> reductionBarrett(mod, mu);
    garr[0] = BN::bn1();
    garr[1] = g;
    garr[2] = g.Qrt().reductionBarrett(mod,mu);
    for(bt2 i = 1; i < KarySize/ 2; i++)
        garr[2 * i + 1] = (garr[2 * i - 1] * garr[2]).reductionBarrett(mod,mu);
    return move(garr);

}